

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O1

ChConstraint * __thiscall chrono::ChConstraint::operator=(ChConstraint *this,ChConstraint *other)

{
  if (other != this) {
    this->c_i = other->c_i;
    this->g_i = other->g_i;
    this->b_i = other->b_i;
    this->l_i = other->l_i;
    this->cfm_i = other->cfm_i;
    this->valid = other->valid;
    this->active = other->active;
    this->disabled = other->disabled;
    this->redundant = other->redundant;
    this->broken = other->broken;
    this->mode = other->mode;
  }
  return this;
}

Assistant:

ChConstraint& ChConstraint::operator=(const ChConstraint& other) {
    if (&other == this)
        return *this;

    c_i = other.c_i;
    g_i = other.g_i;
    b_i = other.b_i;
    l_i = other.l_i;
    cfm_i = other.cfm_i;
    valid = other.valid;
    active = other.active;
    disabled = other.disabled;
    redundant = other.redundant;
    broken = other.broken;
    mode = other.mode;

    return *this;
}